

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O1

Var Js::JavascriptString::EntryToString(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  Var pvVar7;
  RecyclableObject *pRVar8;
  Type TVar9;
  int in_stack_00000010;
  undefined4 local_68;
  undefined4 uStack_64;
  Type TStack_60;
  JavascriptString *local_58;
  JavascriptString *str;
  Var result;
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x8d0,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d2801c;
    *puVar6 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  result = args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)&result,(CallInfo *)&args.super_Arguments.Values);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x8d3,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00d2801c;
    *puVar6 = 0;
  }
  if (((ulong)result & 0xffffff) != 0) {
    local_58 = (JavascriptString *)0x0;
    pvVar7 = Arguments::operator[]((Arguments *)&result,0);
    BVar4 = GetThisValueVar(pvVar7,&local_58,pSVar1);
    if (BVar4 != 0) {
      return local_58;
    }
    pvVar7 = Arguments::operator[]((Arguments *)&result,0);
    if (pvVar7 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00d2801c;
      *puVar6 = 0;
    }
    if (((ulong)pvVar7 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar7 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00d2801c;
      *puVar6 = 0;
    }
    TVar9 = TypeIds_FirstNumberType;
    if ((((ulong)pvVar7 & 0xffff000000000000) != 0x1000000000000) &&
       (TVar9 = TypeIds_Number, (ulong)pvVar7 >> 0x32 == 0)) {
      pRVar8 = UnsafeVarTo<Js::RecyclableObject>(pvVar7);
      if (pRVar8 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) goto LAB_00d2801c;
        *puVar6 = 0;
      }
      TVar9 = ((pRVar8->type).ptr)->typeId;
      if ((0x57 < (int)TVar9) && (BVar4 = RecyclableObject::IsExternal(pRVar8), BVar4 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
LAB_00d2801c:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
    }
    if (TVar9 == TypeIds_HostDispatch) {
      pvVar7 = Arguments::operator[]((Arguments *)&result,0);
      pRVar8 = UnsafeVarTo<Js::RecyclableObject>(pvVar7);
      local_68 = result._0_4_;
      uStack_64 = result._4_4_;
      TStack_60._0_4_ = args.super_Arguments.Info._0_4_;
      TStack_60._4_4_ = args.super_Arguments.Info._4_4_;
      iVar5 = (*(pRVar8->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x55])(pRVar8,EntryToString,&local_68,&str);
      if (iVar5 != 0) {
        return str;
      }
    }
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec3f,L"String.prototype.toString");
}

Assistant:

Var JavascriptString::EntryToString(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if(args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedString, _u("String.prototype.toString"));
        }
        AssertMsg(args.Info.Count > 0, "Negative argument count");

        JavascriptString* str = nullptr;
        if (!GetThisValueVar(args[0], &str, scriptContext))
        {
            if (JavascriptOperators::GetTypeId(args[0]) == TypeIds_HostDispatch)
            {
                Var result;
                if (UnsafeVarTo<RecyclableObject>(args[0])->InvokeBuiltInOperationRemotely(EntryToString, args, &result))
                {
                    return result;
                }
            }

            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedString, _u("String.prototype.toString"));
        }

        return str;
    }